

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

Container *
Vector::factory(Registry *registry,
               list<const_Typelib::Type_*,_std::allocator<const_Typelib::Type_*>_> *on)

{
  Type *on_00;
  byte bVar1;
  int iVar2;
  Category CVar3;
  size_type sVar4;
  runtime_error *this;
  const_reference ppTVar5;
  Vector *this_00;
  undefined8 uVar6;
  BadCategory *this_01;
  Type *type;
  string local_a0 [32];
  Vector *local_80;
  Vector *new_type;
  undefined1 local_58 [8];
  string full_name;
  Type *contained_type;
  list<const_Typelib::Type_*,_std::allocator<const_Typelib::Type_*>_> *on_local;
  Registry *registry_local;
  
  sVar4 = std::__cxx11::list<const_Typelib::Type_*,_std::allocator<const_Typelib::Type_*>_>::size
                    (on);
  if (sVar4 != 1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"expected only one template argument for std::vector");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppTVar5 = std::__cxx11::list<const_Typelib::Type_*,_std::allocator<const_Typelib::Type_*>_>::front
                      (on);
  on_00 = *ppTVar5;
  Typelib::Type::getName_abi_cxx11_();
  fullName((Vector *)local_58,(string *)&new_type);
  std::__cxx11::string::~string((string *)&new_type);
  bVar1 = Typelib::Registry::has((string *)registry,SUB81(local_58,0));
  if ((bVar1 & 1) == 0) {
    this_00 = (Vector *)operator_new(0xa0);
    Vector(this_00,on_00);
    local_80 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"",(allocator *)((long)&type + 7));
    Typelib::Registry::add((Type *)registry,(string *)this_00);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&type + 7));
    registry_local = (Registry *)local_80;
  }
  else {
    uVar6 = Typelib::Registry::get((string *)registry);
    iVar2 = Typelib::Type::getCategory();
    if (iVar2 != 7) {
      this_01 = (BadCategory *)__cxa_allocate_exception(0x18);
      CVar3 = Typelib::Type::getCategory();
      Typelib::BadCategory::BadCategory(this_01,CVar3,Container);
      __cxa_throw(this_01,&Typelib::BadCategory::typeinfo,Typelib::BadCategory::~BadCategory);
    }
    registry_local =
         (Registry *)__dynamic_cast(uVar6,&Typelib::Type::typeinfo,&Typelib::Container::typeinfo,0);
    if (registry_local == (Registry *)0x0) {
      __cxa_bad_cast();
    }
  }
  type._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_58);
  return (Container *)registry_local;
}

Assistant:

Container const& Vector::factory(Registry& registry, std::list<Type const*> const& on)
{
    if (on.size() != 1)
        throw std::runtime_error("expected only one template argument for std::vector");

    Type const& contained_type = *on.front();
    std::string full_name = Vector::fullName(contained_type.getName());
    if (! registry.has(full_name))
    {
        Vector* new_type = new Vector(contained_type);
        registry.add(new_type);
        return *new_type;
    }

    const Type *type = registry.get(full_name);
    if (type->getCategory() != Type::Container) {
        throw BadCategory(type->getCategory(), Type::Container);
    } else {
        return dynamic_cast<Container const &>(*type);
    }
}